

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_ironlich.cpp
# Opt level: O0

int AF_A_LichAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *pAVar1;
  int damage_00;
  PClassActor *pPVar2;
  AActor *pAVar3;
  FState *newstate;
  bool bVar4;
  double dVar5;
  int local_ec;
  bool local_c6;
  bool local_c3;
  FSoundID local_c0;
  FSoundID local_bc;
  DVector3 local_b8;
  FName local_a0;
  FName local_9c;
  FSoundID local_98;
  uint local_94;
  int dist;
  FName local_88;
  int local_84;
  int local_80;
  int newdam;
  int damage;
  int randAttack;
  AActor *target;
  AActor *mo;
  AActor *baseFire;
  AActor *fire;
  void *pvStack_50;
  int i;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                  ,0x42,"int AF_A_LichAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_c3 = true;
    if (stateowner != (AActor *)0x0) {
      local_c3 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_c3 != false) {
      self._0_4_ = (int)self + 1;
      if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
        bVar4 = false;
        if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
           (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
          bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar4) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                        ,0x42,"int AF_A_LichAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
        local_c6 = true;
        if ((DObject *)stateinfo != (DObject *)0x0) {
          local_c6 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
        }
        if (local_c6 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                        ,0x42,"int AF_A_LichAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      else {
        stateinfo = (FStateParamInfo *)stateowner;
      }
      self._0_4_ = (int)self + 1;
      if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
        bVar4 = false;
        if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
           (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
          bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar4) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                        ,0x42,"int AF_A_LichAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        pvStack_50 = pVStack_20[(int)self].field_0.field_1.a;
      }
      else {
        pvStack_50 = (void *)0x0;
      }
      _damage = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
      if (_damage != (AActor *)0x0) {
        A_FaceTarget(stateowner);
        bVar4 = AActor::CheckMeleeRange(stateowner);
        if (bVar4) {
          damage_00 = FRandom::HitDice(&pr_atk,6);
          pAVar1 = stateowner;
          pAVar3 = _damage;
          local_80 = damage_00;
          FName::FName(&local_88,NAME_Melee);
          TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff70,0.0);
          local_84 = P_DamageMobj(pAVar3,pAVar1,pAVar1,damage_00,&local_88,0,
                                  (DAngle *)&stack0xffffffffffffff70);
          local_ec = local_84;
          if (local_84 < 1) {
            local_ec = local_80;
          }
          P_TraceBleed(local_ec,_damage,stateowner);
        }
        else {
          dVar5 = AActor::Distance2D(stateowner,_damage,false);
          local_94 = (uint)(512.0 < dVar5);
          newdam = FRandom::operator()(&pr_atk);
          pAVar1 = stateowner;
          pAVar3 = _damage;
          if (newdam < AF_A_LichAttack::atkResolve1[(int)local_94]) {
            pPVar2 = PClass::FindActor("HeadFX1");
            P_SpawnMissile(pAVar1,pAVar3,pPVar2,(AActor *)0x0);
            pAVar3 = stateowner;
            FSoundID::FSoundID(&local_98,"ironlich/attack2");
            S_Sound(pAVar3,4,&local_98,1.0,1.0);
          }
          else if (newdam < AF_A_LichAttack::atkResolve2[(int)local_94]) {
            pPVar2 = PClass::FindActor("HeadFX3");
            pAVar3 = P_SpawnMissile(pAVar1,pAVar3,pPVar2,(AActor *)0x0);
            if (pAVar3 != (AActor *)0x0) {
              mo = pAVar3;
              FName::FName(&local_9c,"NoGrow");
              newstate = AActor::FindState(pAVar3,&local_9c);
              AActor::SetState(pAVar3,newstate,false);
              for (fire._4_4_ = 0; fire._4_4_ < 5; fire._4_4_ = fire._4_4_ + 1) {
                FName::FName(&local_a0,"HeadFX3");
                AActor::Pos(&local_b8,mo);
                baseFire = Spawn(&local_a0,&local_b8,ALLOW_REPLACE);
                pAVar3 = stateowner;
                if (fire._4_4_ == 0) {
                  FSoundID::FSoundID(&local_bc,"ironlich/attack1");
                  S_Sound(pAVar3,4,&local_bc,1.0,1.0);
                }
                (baseFire->target).field_0 = (mo->target).field_0;
                TAngle<double>::operator=(&(baseFire->Angles).Yaw,&(mo->Angles).Yaw);
                TVector3<double>::operator=(&baseFire->Vel,&mo->Vel);
                baseFire->Damage = (VMFunction *)0x0;
                baseFire->health = (fire._4_4_ + 1) * 2;
                P_CheckMissileSpawn(baseFire,stateowner->radius);
              }
            }
          }
          else {
            target = P_SpawnMissile(stateowner,_damage,
                                    (PClassActor *)AWhirlwind::RegistrationInfo.MyClass,
                                    (AActor *)0x0);
            if (target != (AActor *)0x0) {
              AActor::AddZ(target,-32.0,true);
              TObjPtr<AActor>::operator=(&target->tracer,_damage);
              pAVar3 = stateowner;
              target->health = 700;
              FSoundID::FSoundID(&local_c0,"ironlich/attack3");
              S_Sound(pAVar3,4,&local_c0,1.0,1.0);
            }
          }
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                  ,0x42,"int AF_A_LichAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_ironlich.cpp"
                ,0x42,"int AF_A_LichAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LichAttack)
{
	PARAM_ACTION_PROLOGUE;

	int i;
	AActor *fire;
	AActor *baseFire;
	AActor *mo;
	AActor *target;
	int randAttack;
	static const int atkResolve1[] = { 50, 150 };
	static const int atkResolve2[] = { 150, 200 };

	// Ice ball		(close 20% : far 60%)
	// Fire column	(close 40% : far 20%)
	// Whirlwind	(close 40% : far 20%)
	// Distance threshold = 8 cells

	target = self->target;
	if (target == NULL)
	{
		return 0;
	}
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = pr_atk.HitDice (6);
		int newdam = P_DamageMobj (target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, target, self);
		return 0;
	}
	int dist = self->Distance2D(target) > 8 * 64;
	randAttack = pr_atk ();
	if (randAttack < atkResolve1[dist])
	{ // Ice ball
		P_SpawnMissile (self, target, PClass::FindActor("HeadFX1"));
		S_Sound (self, CHAN_BODY, "ironlich/attack2", 1, ATTN_NORM);
	}
	else if (randAttack < atkResolve2[dist])
	{ // Fire column
		baseFire = P_SpawnMissile (self, target, PClass::FindActor("HeadFX3"));
		if (baseFire != NULL)
		{
			baseFire->SetState (baseFire->FindState("NoGrow"));
			for (i = 0; i < 5; i++)
			{
				fire = Spawn("HeadFX3", baseFire->Pos(), ALLOW_REPLACE);
				if (i == 0)
				{
					S_Sound (self, CHAN_BODY, "ironlich/attack1", 1, ATTN_NORM);
				}
				fire->target = baseFire->target;
				fire->Angles.Yaw = baseFire->Angles.Yaw;
				fire->Vel = baseFire->Vel;
				fire->Damage = NULL;
				fire->health = (i+1) * 2;
				P_CheckMissileSpawn (fire, self->radius);
			}
		}
	}
	else
	{ // Whirlwind
		mo = P_SpawnMissile (self, target, RUNTIME_CLASS(AWhirlwind));
		if (mo != NULL)
		{
			mo->AddZ(-32);
			mo->tracer = target;
			mo->health = 20*TICRATE; // Duration
			S_Sound (self, CHAN_BODY, "ironlich/attack3", 1, ATTN_NORM);
		}
	}
	return 0;
}